

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::
     filldata<boost::iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>_>
     ::fill(ostream *stream,
           iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
           *in)

{
  iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
  *in_local;
  ostream *stream_local;
  
  boost::operator<<(stream,in);
  return;
}

Assistant:

static void fill(std::ostream* stream, const T& in) {
#if defined(_MSC_VER) && _MSC_VER <= 1900
        insert_hack_t<T>::insert(*stream, in);
#else
        operator<<(*stream, in);
#endif
        }